

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Node<unsigned_int> *this,KeyParser *ctx)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Fragment FVar3;
  Node<unsigned_int> *node;
  ulong uVar4;
  pointer psVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  void *pvVar8;
  undefined1 uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> subs;
  bool child_state;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  bool local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  void *local_98;
  void *pvStack_90;
  long local_88;
  bool local_71;
  KeyParser *local_70;
  undefined1 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_script_ctx == P2WSH) {
    local_68 = 0;
  }
  else {
    if (this->m_script_ctx != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    local_68 = 1;
  }
  local_71 = false;
  local_88 = 0;
  local_98 = (void *)0x0;
  pvStack_90 = (void *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60._M_dataplus._M_p._0_4_ = 0;
  local_70 = ctx;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
  ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
              *)&local_98,this,(int *)&local_60,&local_71);
  if (pvStack_90 != local_98) {
    uVar9 = (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged;
    do {
      pvVar8 = pvStack_90;
      node = *(Node<unsigned_int> **)((long)pvStack_90 + -0x18);
      uVar4 = *(ulong *)((long)pvStack_90 + -0x10);
      psVar5 = (node->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      subs.m_size = (long)(node->subs).
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4;
      if (uVar4 < subs.m_size) {
        *(ulong *)((long)pvStack_90 + -0x10) = uVar4 + 1;
        FVar3 = node->fragment;
        local_b9 = true;
        if (6 < FVar3 - WRAP_A) {
          if (FVar3 == OR_I) {
            local_b9 = ((psVar5->
                        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->fragment == 0;
            if (!local_b9) {
              local_b9 = (psVar5[1].
                          super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->fragment == 0;
            }
          }
          else if ((FVar3 != AND_V) ||
                  ((psVar5[1].
                    super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->fragment != 1)) {
            local_b9 = false;
          }
        }
        local_60._M_dataplus._M_p._0_4_ = 0;
        std::
        vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
        ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
                  ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
                    *)&local_98,
                   psVar5[uVar4].
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(int *)&local_60,&local_b9);
        bVar10 = false;
      }
      else {
        if ((ulong)((long)local_b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) < subs.m_size) {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = (bool)uVar9;
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:821:21)]"
                       );
        }
        subs.m_data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)local_b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      subs.m_size * -0x20 +
                      ((long)local_b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start));
        const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}::
        operator()::string_>__const
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,&local_70,*(bool *)((long)pvStack_90 + -8),node,subs);
        bVar10 = local_40 == '\0';
        if (bVar10) {
          uVar9 = 0;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     ((long)(node->subs).
                            super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(node->subs).
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) * -2),
                     (iterator)
                     local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                     &local_60);
          pvStack_90 = (void *)((long)pvVar8 + -0x18);
        }
        if (local_40 == '\x01') {
          local_40 = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_
                                    ),local_60.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (bVar10) {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = (bool)uVar9;
        goto LAB_0039584a;
      }
    } while (pvStack_90 != local_98);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = (bool)uVar9;
  }
  if ((long)local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:821:21)]"
                 );
  }
  psVar1 = (size_type *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(size_type **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = psVar1;
  _Var6._M_p = ((local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  paVar2 = &(local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p == paVar2) {
    uVar7 = *(undefined8 *)
             ((long)&(local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8);
    *psVar1 = paVar2->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x18) = uVar7;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = _Var6._M_p;
    *(size_type *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x10) = paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  ((local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)paVar2;
  (local_b8.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0;
  ((local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_local_buf[0] = '\0';
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
LAB_0039584a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> ToString(const CTx& ctx) const {
        // To construct the std::string representation for a Miniscript object, we use
        // the TreeEvalMaybe algorithm. The State is a boolean: whether the parent node is a
        // wrapper. If so, non-wrapper expressions must be prefixed with a ":".
        auto downfn = [](bool, const Node& node, size_t) {
            return (node.fragment == Fragment::WRAP_A || node.fragment == Fragment::WRAP_S ||
                    node.fragment == Fragment::WRAP_D || node.fragment == Fragment::WRAP_V ||
                    node.fragment == Fragment::WRAP_J || node.fragment == Fragment::WRAP_N ||
                    node.fragment == Fragment::WRAP_C ||
                    (node.fragment == Fragment::AND_V && node.subs[1]->fragment == Fragment::JUST_1) ||
                    (node.fragment == Fragment::OR_I && node.subs[0]->fragment == Fragment::JUST_0) ||
                    (node.fragment == Fragment::OR_I && node.subs[1]->fragment == Fragment::JUST_0));
        };
        // The upward function computes for a node, given whether its parent is a wrapper,
        // and the string representations of its child nodes, the string representation of the node.
        const bool is_tapscript{IsTapscript(m_script_ctx)};
        auto upfn = [&ctx, is_tapscript](bool wrapped, const Node& node, Span<std::string> subs) -> std::optional<std::string> {
            std::string ret = wrapped ? ":" : "";

            switch (node.fragment) {
                case Fragment::WRAP_A: return "a" + std::move(subs[0]);
                case Fragment::WRAP_S: return "s" + std::move(subs[0]);
                case Fragment::WRAP_C:
                    if (node.subs[0]->fragment == Fragment::PK_K) {
                        // pk(K) is syntactic sugar for c:pk_k(K)
                        auto key_str = ctx.ToString(node.subs[0]->keys[0]);
                        if (!key_str) return {};
                        return std::move(ret) + "pk(" + std::move(*key_str) + ")";
                    }
                    if (node.subs[0]->fragment == Fragment::PK_H) {
                        // pkh(K) is syntactic sugar for c:pk_h(K)
                        auto key_str = ctx.ToString(node.subs[0]->keys[0]);
                        if (!key_str) return {};
                        return std::move(ret) + "pkh(" + std::move(*key_str) + ")";
                    }
                    return "c" + std::move(subs[0]);
                case Fragment::WRAP_D: return "d" + std::move(subs[0]);
                case Fragment::WRAP_V: return "v" + std::move(subs[0]);
                case Fragment::WRAP_J: return "j" + std::move(subs[0]);
                case Fragment::WRAP_N: return "n" + std::move(subs[0]);
                case Fragment::AND_V:
                    // t:X is syntactic sugar for and_v(X,1).
                    if (node.subs[1]->fragment == Fragment::JUST_1) return "t" + std::move(subs[0]);
                    break;
                case Fragment::OR_I:
                    if (node.subs[0]->fragment == Fragment::JUST_0) return "l" + std::move(subs[1]);
                    if (node.subs[1]->fragment == Fragment::JUST_0) return "u" + std::move(subs[0]);
                    break;
                default: break;
            }
            switch (node.fragment) {
                case Fragment::PK_K: {
                    auto key_str = ctx.ToString(node.keys[0]);
                    if (!key_str) return {};
                    return std::move(ret) + "pk_k(" + std::move(*key_str) + ")";
                }
                case Fragment::PK_H: {
                    auto key_str = ctx.ToString(node.keys[0]);
                    if (!key_str) return {};
                    return std::move(ret) + "pk_h(" + std::move(*key_str) + ")";
                }
                case Fragment::AFTER: return std::move(ret) + "after(" + util::ToString(node.k) + ")";
                case Fragment::OLDER: return std::move(ret) + "older(" + util::ToString(node.k) + ")";
                case Fragment::HASH256: return std::move(ret) + "hash256(" + HexStr(node.data) + ")";
                case Fragment::HASH160: return std::move(ret) + "hash160(" + HexStr(node.data) + ")";
                case Fragment::SHA256: return std::move(ret) + "sha256(" + HexStr(node.data) + ")";
                case Fragment::RIPEMD160: return std::move(ret) + "ripemd160(" + HexStr(node.data) + ")";
                case Fragment::JUST_1: return std::move(ret) + "1";
                case Fragment::JUST_0: return std::move(ret) + "0";
                case Fragment::AND_V: return std::move(ret) + "and_v(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::AND_B: return std::move(ret) + "and_b(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::OR_B: return std::move(ret) + "or_b(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::OR_D: return std::move(ret) + "or_d(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::OR_C: return std::move(ret) + "or_c(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::OR_I: return std::move(ret) + "or_i(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                case Fragment::ANDOR:
                    // and_n(X,Y) is syntactic sugar for andor(X,Y,0).
                    if (node.subs[2]->fragment == Fragment::JUST_0) return std::move(ret) + "and_n(" + std::move(subs[0]) + "," + std::move(subs[1]) + ")";
                    return std::move(ret) + "andor(" + std::move(subs[0]) + "," + std::move(subs[1]) + "," + std::move(subs[2]) + ")";
                case Fragment::MULTI: {
                    CHECK_NONFATAL(!is_tapscript);
                    auto str = std::move(ret) + "multi(" + util::ToString(node.k);
                    for (const auto& key : node.keys) {
                        auto key_str = ctx.ToString(key);
                        if (!key_str) return {};
                        str += "," + std::move(*key_str);
                    }
                    return std::move(str) + ")";
                }
                case Fragment::MULTI_A: {
                    CHECK_NONFATAL(is_tapscript);
                    auto str = std::move(ret) + "multi_a(" + util::ToString(node.k);
                    for (const auto& key : node.keys) {
                        auto key_str = ctx.ToString(key);
                        if (!key_str) return {};
                        str += "," + std::move(*key_str);
                    }
                    return std::move(str) + ")";
                }
                case Fragment::THRESH: {
                    auto str = std::move(ret) + "thresh(" + util::ToString(node.k);
                    for (auto& sub : subs) {
                        str += "," + std::move(sub);
                    }
                    return std::move(str) + ")";
                }
                default: break;
            }
            assert(false);
        };

        return TreeEvalMaybe<std::string>(false, downfn, upfn);
    }